

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O1

optional<slang::TimeUnit> __thiscall slang::parsing::Lexer::lexTimeLiteral(Lexer *this)

{
  char *pcVar1;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  
  pcVar1 = this->sourceBuffer;
  uVar2 = 0;
  switch(*pcVar1) {
  case 'm':
    if (pcVar1[1] != 's') break;
    uVar2 = 1;
LAB_0039bfa9:
    lVar4 = 2;
    goto LAB_0039bfbb;
  case 'n':
    if (pcVar1[1] == 's') {
      uVar2 = 3;
      goto LAB_0039bfa9;
    }
    break;
  case 'o':
  case 'q':
  case 'r':
  case 't':
    break;
  case 'p':
    if (pcVar1[1] == 's') {
      uVar2 = 4;
      goto LAB_0039bfa9;
    }
    break;
  case 's':
    lVar4 = 1;
    uVar2 = 0;
LAB_0039bfbb:
    this->sourceBuffer = pcVar1 + lVar4;
    uVar3 = 0x100;
    goto LAB_0039bfc6;
  case 'u':
    if (pcVar1[1] == 's') {
      uVar2 = 2;
      goto LAB_0039bfa9;
    }
    break;
  default:
    uVar3 = 0;
    if (*pcVar1 != 'f') goto LAB_0039bfc6;
    if (pcVar1[1] == 's') {
      uVar2 = 5;
      goto LAB_0039bfa9;
    }
  }
  uVar2 = 0;
  uVar3 = 0;
LAB_0039bfc6:
  return (_Optional_base<slang::TimeUnit,_true,_true>)
         (_Optional_base<slang::TimeUnit,_true,_true>)(uVar3 | uVar2);
}

Assistant:

char peek() const { return *sourceBuffer; }